

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::MultiTransformNode::print(MultiTransformNode *this,ostream *cout,int depth)

{
  uint n;
  Node *pNVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<(cout,"MultiTransformNode @ ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2," { ");
  std::endl<char,std::char_traits<char>>(poVar2);
  n = depth + 1;
  tab(cout,n);
  poVar2 = std::operator<<(cout,"closed = ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(cout,n);
  poVar2 = std::operator<<(cout,"numInstances = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((this->spaces).
      super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->spaces).
      super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    tab(cout,n);
    poVar2 = std::operator<<(cout,"numTimeSteps = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  tab(cout,n);
  std::operator<<(cout,"child = ");
  pNVar1 = (this->child).ptr;
  (*(pNVar1->super_RefCount)._vptr_RefCount[4])(pNVar1,cout,(ulong)n);
  tab(cout,depth);
  poVar2 = std::operator<<(cout,"}");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::print(std::ostream& cout, int depth)
  {
    cout << "MultiTransformNode @ " << this << " { " << std::endl;
    tab(cout, depth+1); cout << "closed = " << closed << std::endl;
    tab(cout, depth+1); cout << "numInstances = " << spaces.size() << std::endl;
    if (spaces.size() > 0) {
      tab(cout, depth+1); cout << "numTimeSteps = " << spaces[0].size() << std::endl;
    }
    tab(cout, depth+1); cout << "child = "; child->print(cout,depth+1);
    tab(cout, depth); cout << "}" << std::endl;
  }